

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.hpp
# Opt level: O1

double __thiscall
units::convert<units::precise_unit,units::precise_unit>
          (units *this,double val,precise_unit *start,precise_unit *result)

{
  uint uVar1;
  bool bVar2;
  uint uVar3;
  unit_data uVar4;
  precise_unit *result_00;
  precise_unit *result_01;
  precise_unit *extraout_RDX;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dc_01;
  undefined4 extraout_XMM0_Dd;
  undefined4 extraout_XMM0_Dd_00;
  undefined4 extraout_XMM0_Dd_01;
  double in_XMM1_Qa;
  double dVar5;
  ulong in_XMM1_Qb;
  unit_data base_result;
  unit local_40;
  double local_38;
  ulong uStack_30;
  unit local_28;
  
  bVar2 = precise_unit::operator==((precise_unit *)this,start);
  if (bVar2) {
    return val;
  }
  uVar1 = *(uint *)(this + 8);
  if (*(double *)this == 1.0 && uVar1 == 0x30000000) {
    return val;
  }
  uVar4 = start->base_units_;
  if (start->multiplier_ == 1.0 && uVar4 == (unit_data)0x30000000) {
    return val;
  }
  if ((((uVar1 | (uint)uVar4) >> 0x1e & 1) != 0) && ((((uint)uVar4 ^ uVar1) & 0xfffffff) == 0)) {
    in_XMM1_Qa = detail::convertFlaggedUnits<units::precise_unit,units::precise_unit>
                           (val,(precise_unit *)this,start,NAN);
    in_XMM1_Qb = CONCAT44(extraout_XMM0_Dd,extraout_XMM0_Dc);
    if (!NAN(in_XMM1_Qa) && !NAN(in_XMM1_Qa)) {
      return in_XMM1_Qa;
    }
  }
  local_40.multiplier_ = *(float *)(this + 8);
  if (((int)local_40.multiplier_ < 0) || (uVar4 = start->base_units_, (int)uVar4 < 0)) {
    if ((((uint)start->base_units_ ^ (uint)local_40.multiplier_) & 0x307ffff) == 0) {
      dVar5 = precise::equations::convert_equnit_to_value(val,(unit_data *)&local_40);
      local_40.multiplier_ = *(float *)&start->base_units_;
      dVar5 = precise::equations::convert_value_to_equnit
                        ((dVar5 * *(double *)this) / start->multiplier_,(unit_data *)&local_40);
      return dVar5;
    }
LAB_0020b486:
    dVar5 = NAN;
  }
  else {
    if (uVar4 != (unit_data)local_40.multiplier_) {
      if ((((uint)local_40.multiplier_ & (uint)uVar4) >> 0x1c & 1) == 0) {
        if ((((uint)uVar4 | (uint)local_40.multiplier_) >> 0x1c & 1) != 0) {
          local_28.base_units_ = uVar4;
          local_28.multiplier_ = (float)start->multiplier_;
          local_40.base_units_ = (unit_data)local_40.multiplier_;
          local_40.multiplier_ = (float)*(double *)this;
          dVar5 = puconversion::assumedBase(&local_40,&local_28);
          if (!NAN(dVar5)) {
            dVar5 = convert<units::precise_unit,units::precise_unit>
                              (val,(precise_unit *)this,start,dVar5);
            return dVar5;
          }
          goto LAB_0020b486;
        }
      }
      else {
        local_40.base_units_ = (unit_data)local_40.multiplier_;
        local_40.multiplier_ = (float)*(double *)this;
        local_38 = in_XMM1_Qa;
        uStack_30 = in_XMM1_Qb;
        bVar2 = unit::operator==(&local_40,(unit *)&pu);
        if (bVar2) {
          return val;
        }
        local_28.multiplier_ = (float)start->multiplier_;
        local_28.base_units_ = start->base_units_;
        bVar2 = unit::operator==(&local_28,(unit *)&pu);
        if (bVar2) {
          return val;
        }
        local_40.multiplier_ = *(float *)(this + 8);
        local_28.multiplier_ = (float)start->base_units_;
        dVar5 = puconversion::knownConversions(val,(unit_data *)&local_40,(unit_data *)&local_28);
        in_XMM1_Qa = (double)(-(ulong)NAN(dVar5) & (ulong)local_38 |
                             ~-(ulong)NAN(dVar5) & (ulong)dVar5);
        in_XMM1_Qb = CONCAT44(extraout_XMM0_Dd_00,extraout_XMM0_Dc_00) & uStack_30 |
                     ~CONCAT44(extraout_XMM0_Dd_00,extraout_XMM0_Dc_00) &
                     CONCAT44(extraout_XMM0_Dd_00,extraout_XMM0_Dc_00);
        if (!NAN(dVar5) && !NAN(dVar5)) {
          return in_XMM1_Qa;
        }
      }
      uVar1 = *(uint *)(this + 8);
      local_40.multiplier_ = *(float *)&start->base_units_;
      uVar3 = (uint)local_40.multiplier_ ^ uVar1;
      if ((uVar3 & 0xfffffff) != 0) {
        if ((uVar3 & 0x307ffff) == 0) {
          local_38 = in_XMM1_Qa;
          uStack_30 = in_XMM1_Qb;
          dVar5 = detail::convertCountingUnits<units::precise_unit,units::precise_unit>
                            (val,(precise_unit *)this,start);
          in_XMM1_Qa = (double)(-(ulong)NAN(dVar5) & (ulong)local_38 |
                               ~-(ulong)NAN(dVar5) & (ulong)dVar5);
          in_XMM1_Qb = CONCAT44(extraout_XMM0_Dd_01,extraout_XMM0_Dc_01) & uStack_30 |
                       ~CONCAT44(extraout_XMM0_Dd_01,extraout_XMM0_Dc_01) &
                       CONCAT44(extraout_XMM0_Dd_01,extraout_XMM0_Dc_01);
          if (!NAN(dVar5) && !NAN(dVar5)) {
            return in_XMM1_Qa;
          }
        }
        local_38 = in_XMM1_Qa;
        uStack_30 = in_XMM1_Qb;
        uVar4 = detail::unit_data::inv((unit_data *)&local_40);
        if ((((uint)uVar4 ^ uVar1) & 0xfffffff) != 0) {
          if (((((byte)this[0xb] & 0x40) != 0) ||
              (result_01 = result_00, ((start->base_units_).field_0x3 & 0x40) != 0)) &&
             (dVar5 = detail::extraValidConversions<units::precise_unit,units::precise_unit>
                                ((detail *)this,val,start,result_00), result_01 = extraout_RDX,
             !NAN(dVar5))) {
            return (double)(-(ulong)NAN(dVar5) & (ulong)local_38 |
                           ~-(ulong)NAN(dVar5) & (ulong)dVar5);
          }
          dVar5 = detail::otherUsefulConversions<units::precise_unit,units::precise_unit>
                            ((detail *)this,val,start,result_01);
          return dVar5;
        }
        return 1.0 / (val * *(double *)this * start->multiplier_);
      }
    }
    dVar5 = (val * *(double *)this) / start->multiplier_;
  }
  return dVar5;
}

Assistant:

double convert(double val, const UX& start, const UX2& result)
{
    static_assert(
        std::is_same<UX, unit>::value || std::is_same<UX, precise_unit>::value,
        "convert argument types must be unit or precise_unit");
    static_assert(
        std::is_same<UX2, unit>::value ||
            std::is_same<UX2, precise_unit>::value,
        "convert argument types must be unit or precise_unit");
    if (start == result || is_default(start) || is_default(result)) {
        return val;
    }
    if ((start.has_e_flag() || result.has_e_flag()) &&
        start.has_same_base(result.base_units())) {
        double converted_val = detail::convertFlaggedUnits(val, start, result);
        if (!std::isnan(converted_val)) {
            return converted_val;
        }
    }
    if (start.is_equation() || result.is_equation()) {
        if (!start.base_units().equivalent_non_counting(result.base_units())) {
            return constants::invalid_conversion;
        }
        double keyval = precise::equations::convert_equnit_to_value(
            val, start.base_units());
        keyval = keyval * start.multiplier() / result.multiplier();
        return precise::equations::convert_value_to_equnit(
            keyval, result.base_units());
    }
    if (start.base_units() == result.base_units()) {
        return val * start.multiplier() / result.multiplier();
    }
    // check if both are pu since this doesn't require knowing a base unit
    if (start.is_per_unit() &&
        result.is_per_unit()) {  // we know they have different unit basis
        if (unit_cast(start) == pu || unit_cast(result) == pu) {
            // generic pu just means the units are equivalent since the other is
            // puXX already
            return val;
        }
        double converted_val = puconversion::knownConversions(
            val, start.base_units(), result.base_units());
        if (!std::isnan(converted_val)) {
            return converted_val;
        }
    } else if (start.is_per_unit() || result.is_per_unit()) {
        double genBase =
            puconversion::assumedBase(unit_cast(start), unit_cast(result));
        if (!std::isnan(genBase)) {
            return convert(val, start, result, genBase);
        }
        // other assumptions for PU base are probably dangerous so shouldn't be
        // allowed
        return constants::invalid_conversion;
    }

    auto base_start = start.base_units();
    auto base_result = result.base_units();
    if (base_start.has_same_base(base_result)) {
        // ignore i flag and e flag, special cases have been dealt with already,
        // so those are just markers
        return val * start.multiplier() / result.multiplier();
    }
    // deal with some counting conversions
    if (base_start.equivalent_non_counting(base_result)) {
        double converted_val = detail::convertCountingUnits(val, start, result);
        if (!std::isnan(converted_val)) {
            return converted_val;
        }
    }
    // check for inverse units
    if (base_start.has_same_base(base_result.inv())) {
        // ignore flag and e flag  special cases have been dealt with already,
        // so those are just markers
        return 1.0 / (val * start.multiplier() * result.multiplier());
    }
    if (start.has_e_flag() || result.has_e_flag()) {
        double converted_val =
            detail::extraValidConversions(val, start, result);
        if (!std::isnan(converted_val)) {
            return converted_val;
        }
    }
    // this is the last chance and will return invalid_result if it doesn't find
    // a match
    return detail::otherUsefulConversions(val, start, result);
}